

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::PolyNode::AddChild(PolyNode *this,PolyNode *child)

{
  size_type sVar1;
  PolyNode *local_28;
  uint local_1c;
  PolyNode *pPStack_18;
  uint cnt;
  PolyNode *child_local;
  PolyNode *this_local;
  
  pPStack_18 = child;
  child_local = this;
  sVar1 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::size
                    (&this->Childs);
  local_1c = (uint)sVar1;
  local_28 = pPStack_18;
  std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::push_back
            (&this->Childs,&local_28);
  pPStack_18->Parent = this;
  pPStack_18->Index = local_1c;
  return;
}

Assistant:

void PolyNode::AddChild(PolyNode& child)
{
  unsigned cnt = (unsigned)Childs.size();
  Childs.push_back(&child);
  child.Parent = this;
  child.Index = cnt;
}